

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float pbrt::SampleLinear(Float u,Float a,Float b)

{
  float *pfVar1;
  float in_XMM0_Da;
  float a_00;
  float b_00;
  double dVar2;
  undefined1 auVar3 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  Float x;
  float local_10;
  float local_c;
  undefined1 extraout_var [60];
  
  local_c = in_XMM2_Da;
  a_00 = Sqr<float>(in_XMM1_Da);
  b_00 = Sqr<float>(local_c);
  auVar3._0_4_ = Lerp(in_XMM0_Da,a_00,b_00);
  auVar3._4_60_ = extraout_var;
  dVar2 = std::sqrt(auVar3._0_8_);
  local_10 = (in_XMM0_Da * (in_XMM1_Da + in_XMM2_Da)) / (in_XMM1_Da + SUB84(dVar2,0));
  pfVar1 = std::min<float>(&local_10,(float *)&OneMinusEpsilon);
  return *pfVar1;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleLinear(Float u, Float a, Float b) {
    DCHECK(a >= 0 && b >= 0);
    Float x = u * (a + b) / (a + std::sqrt(Lerp(u, Sqr(a), Sqr(b))));
    return std::min(x, OneMinusEpsilon);
}